

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O0

bool __thiscall cinatra::uri_t::is_websocket(uri_t *this)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  bool bVar1;
  size_t *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> __x;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  bool bVar2;
  size_t in_stack_ffffffffffffffc8;
  size_t sVar3;
  char *in_stack_ffffffffffffffd0;
  char *pcVar4;
  
  __x = sv((char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),(size_t)in_RDI);
  __y._M_str = in_stack_ffffffffffffffd0;
  __y._M_len = in_stack_ffffffffffffffc8;
  bVar1 = std::operator==(__x,__y);
  bVar2 = true;
  if (!bVar1) {
    sVar3 = *in_RDI;
    pcVar4 = (char *)in_RDI[1];
    sv((char *)CONCAT17(1,in_stack_ffffffffffffffb0),(size_t)in_RDI);
    __y_00._M_str = pcVar4;
    __y_00._M_len = sVar3;
    bVar2 = std::operator==(__x,__y_00);
  }
  return bVar2;
}

Assistant:

bool is_websocket() { return schema == "ws"sv || schema == "wss"sv; }